

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getFullyQualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  IdentifierPath local_90;
  string local_38;
  ModuleDeclaration *local_18;
  ModuleDeclaration *this_local;
  
  local_18 = this;
  this_local = (ModuleDeclaration *)__return_storage_ptr__;
  (*(this->module->super_ASTObject)._vptr_ASTObject[0xe])();
  IdentifierPath::toString_abi_cxx11_(&local_38,&local_90);
  Program::stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  IdentifierPath::~IdentifierPath(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getFullyQualifiedName() const
{
    return Program::stripRootNamespaceFromQualifiedPath (module.getFullyQualifiedDisplayPath().toString());
}